

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int string_cmp_chars(http_string_t string,char *chars)

{
  ulong uVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  sVar3 = strlen(chars);
  uVar2 = 0;
  if (sVar3 == string.len) {
    uVar2 = (uint)string.len;
    bVar5 = (int)uVar2 < 1;
    if (0 < (int)uVar2) {
      if (*string.value == *chars) {
        uVar1 = 1;
        do {
          uVar4 = uVar1;
          if ((uVar2 & 0x7fffffff) == uVar4) break;
          uVar1 = uVar4 + 1;
        } while (string.value[uVar4] == chars[uVar4]);
        bVar5 = (uVar2 & 0x7fffffff) <= uVar4;
      }
      else {
        bVar5 = false;
      }
    }
    uVar2 = (uint)bVar5;
  }
  return uVar2;
}

Assistant:

int string_cmp_chars(http_string_t string, char const chars[static 1]) {
    return strlen(chars) == string.len && nh_string_cmp(string.value, chars, string.len);
}